

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lists.h
# Opt level: O3

shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> __thiscall
Lists<std::shared_ptr<Itemset>_>::last(Lists<std::shared_ptr<Itemset>_> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> sVar2;
  shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> sVar3;
  
  (in_RDI->theNext).
  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->theLast).
       super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (this->theLast).
           super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (in_RDI->theNext).
  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      sVar2.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar2.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = in_RDI;
      return (shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>)
             sVar2.
             super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  sVar3.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = in_RDX._M_pi;
  sVar3.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>)
         sVar3.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ListNodes<T>> last() {
        return theLast;
    }